

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O3

bool __thiscall
QuantLib::EndCriteria::operator()
          (EndCriteria *this,size_t iteration,size_t *statStateIterations,bool positiveOptimization,
          RealType fold,RealType param_5,RealType fnew,RealType normgnew,Type *ecType)

{
  size_t sVar1;
  Type TVar2;
  
  TVar2 = MaxIterations;
  if (iteration < this->maxIterations_) {
    if (this->functionEpsilon_ <= ABS(fnew - fold)) {
      *statStateIterations = 0;
    }
    else {
      sVar1 = *statStateIterations;
      *statStateIterations = sVar1 + 1;
      TVar2 = StationaryFunctionValue;
      if (this->maxStationaryStateIterations_ < sVar1 + 1) goto LAB_0023b1e4;
    }
    if (((!positiveOptimization) ||
        (TVar2 = StationaryFunctionAccuracy, this->functionEpsilon_ <= fnew)) &&
       (TVar2 = ZeroGradientNorm, this->gradientNormEpsilon_ <= normgnew)) {
      return false;
    }
  }
LAB_0023b1e4:
  *ecType = TVar2;
  return true;
}

Assistant:

bool EndCriteria::operator()(const size_t iteration,
                               size_t& statStateIterations,
                               const bool positiveOptimization,
                               const RealType fold,
                               const RealType,  // normgold,
                               const RealType fnew, const RealType normgnew,
                               EndCriteria::Type& ecType) const {
    return checkMaxIterations(iteration, ecType) ||
           checkStationaryFunctionValue(fold, fnew, statStateIterations,
                                        ecType) ||
           checkStationaryFunctionAccuracy(fnew, positiveOptimization,
                                           ecType) ||
           checkZeroGradientNorm(normgnew, ecType);
  }